

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O0

void __thiscall fw::Shader::addSourceFromFile(Shader *this,string *filename)

{
  Writer *pWVar1;
  Writer local_128;
  undefined1 local_b8 [8];
  string shaderCode;
  Writer local_88;
  string *local_18;
  string *filename_local;
  Shader *this_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  el::base::Writer::Writer
            (&local_88,Debug,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Shaders.cpp"
             ,0x25,"void fw::Shader::addSourceFromFile(const string &)",NormalLog,0);
  pWVar1 = el::base::Writer::construct(&local_88,1,"framework");
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [34])"Loading shader source from file: ");
  el::base::Writer::operator<<(pWVar1,local_18);
  el::base::Writer::~Writer(&local_88);
  loadASCIITextFile((string *)local_b8,local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->_sources,(string *)local_b8);
  el::base::Writer::Writer
            (&local_128,Debug,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Shaders.cpp"
             ,0x28,"void fw::Shader::addSourceFromFile(const string &)",NormalLog,0);
  pWVar1 = el::base::Writer::construct(&local_128,1,"framework");
  el::base::Writer::operator<<(pWVar1,(char (*) [26])"Shader loaded succesfully");
  el::base::Writer::~Writer(&local_128);
  std::__cxx11::string::~string((string *)local_b8);
  return;
}

Assistant:

void Shader::addSourceFromFile(const string &filename)
{
    LOG(DEBUG) << "Loading shader source from file: " << filename;
    string shaderCode = loadASCIITextFile(filename);
    _sources.push_back(shaderCode);
    LOG(DEBUG) << "Shader loaded succesfully";
}